

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

reference __thiscall
QVLABase<QGles2UniformDescription>::emplace_back_impl<QGles2UniformDescription>
          (QVLABase<QGles2UniformDescription> *this,qsizetype prealloc,void *array,
          QGles2UniformDescription *args)

{
  QVLABase<QGles2UniformDescription> *this_00;
  QVLABase<QGles2UniformDescription> *pQVar1;
  iterator ptr;
  QGles2UniformDescription *pQVar2;
  QGles2UniformDescription *in_RCX;
  void *in_RDX;
  qsizetype in_RSI;
  QVLABaseBase *in_RDI;
  reference r;
  QVLABaseBase *this_01;
  
  this_01 = in_RDI;
  this_00 = (QVLABase<QGles2UniformDescription> *)QVLABaseBase::size(in_RDI);
  pQVar1 = (QVLABase<QGles2UniformDescription> *)QVLABaseBase::capacity(in_RDI);
  if (this_00 == pQVar1) {
    growBy((QVLABase<QGles2UniformDescription> *)this_01,in_RSI,in_RDX,(qsizetype)in_RCX);
  }
  ptr = end(this_00);
  pQVar2 = q20::construct_at<QGles2UniformDescription,QGles2UniformDescription,void>(ptr,in_RCX);
  in_RDI->s = in_RDI->s + 1;
  return pQVar2;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }